

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
     ::operate(View<float,_false,_std::allocator<unsigned_long>_> *v,undefined4 *x,
              undefined4 *param_3)

{
  size_t sVar1;
  undefined4 *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar1 != 0) {
        uVar4 = 0;
        puVar2 = param_3;
        do {
          *puVar2 = *x;
          sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          puVar2 = puVar2 + sVar1;
          uVar4 = uVar4 + 1;
          sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar4 < sVar1);
      }
      View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      View<float,_false,_std::allocator<unsigned_long>_>::strides(v,0);
      sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,1);
      param_3 = param_3 + sVar1;
      uVar3 = uVar3 + 1;
      sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,1);
    } while (uVar3 < sVar1);
  }
  View<float,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  View<float,_false,_std::allocator<unsigned_long>_>::strides(v,1);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }